

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_dealloc_unittest.cc
# Opt level: O0

void AllocStuff(void)

{
  void **__p;
  void *pvVar1;
  type ppvVar2;
  int local_28;
  int i_1;
  int local_14;
  int i;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> objects;
  
  do_early_stuff();
  __p = (void **)operator_new__(0x2000);
  std::unique_ptr<void*[],std::default_delete<void*[]>>::
  unique_ptr<void**,std::default_delete<void*[]>,void,bool>
            ((unique_ptr<void*[],std::default_delete<void*[]>> *)&stack0xfffffffffffffff0,__p);
  for (local_14 = 0; local_14 < 0x400; local_14 = local_14 + 1) {
    pvVar1 = malloc(0x400);
    ppvVar2 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::operator[]
                        ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)
                         &stack0xfffffffffffffff0,(long)local_14);
    *ppvVar2 = pvVar1;
  }
  for (local_28 = 0; local_28 < 0x400; local_28 = local_28 + 1) {
    ppvVar2 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::operator[]
                        ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)
                         &stack0xfffffffffffffff0,(long)local_28);
    free(*ppvVar2);
  }
  std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr
            ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)&stack0xfffffffffffffff0);
  return;
}

Assistant:

static void AllocStuff() {
  do_early_stuff();

  std::unique_ptr<void*[]> objects{new void*[kNumObjects]};

  for (int i = 0; i < kNumObjects; i++) {
    objects[i] = malloc(kObjectSize);
  }
  for (int i = 0; i < kNumObjects; i++) {
    free(objects[i]);
  }
}